

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_boolean_test.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::TransformBooleanTestInternal
          (duckdb *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *argument,ExpressionType comparison_type,bool comparison_value,int query_location)

{
  _Head_base<0UL,_duckdb::ComparisonExpression_*,_false> _Var1;
  ConstantExpression *this_00;
  type expr;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> this_01;
  ComparisonExpression *this_02;
  type expr_00;
  templated_unique_single_t result;
  templated_unique_single_t bool_value;
  _Head_base<0UL,_duckdb::ComparisonExpression_*,_false> local_c0;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_b8;
  Value local_b0;
  Value local_70;
  
  Value::BOOLEAN(&local_b0,comparison_value);
  this_00 = (ConstantExpression *)operator_new(0x78);
  Value::Value(&local_70,&local_b0);
  ConstantExpression::ConstantExpression(this_00,&local_70);
  local_b8._M_head_impl = this_00;
  Value::~Value(&local_70);
  Value::~Value(&local_b0);
  expr = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
         ::operator*((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                      *)&local_b8);
  Transformer::SetQueryLocation(&expr->super_ParsedExpression,query_location);
  this_01._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       operator_new(0x60);
  LogicalType::LogicalType(&local_70.type_,BOOLEAN);
  local_b0.type_._0_8_ =
       (argument->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (argument->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  CastExpression::CastExpression
            ((CastExpression *)
             this_01._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,&local_70.type_,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_b0,false);
  if ((ParsedExpression *)local_b0.type_._0_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_b0.type_._0_8_)->_vptr_BaseExpression[1])();
  }
  local_b0.type_._0_8_ = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_70.type_);
  this_02 = (ComparisonExpression *)operator_new(0x48);
  local_b0.type_._0_8_ = local_b8._M_head_impl;
  local_b8._M_head_impl = (ConstantExpression *)0x0;
  local_70.type_._0_8_ =
       this_01._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  ComparisonExpression::ComparisonExpression
            (this_02,comparison_type,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_70,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_b0);
  local_c0._M_head_impl = this_02;
  if ((ConstantExpression *)local_b0.type_._0_8_ != (ConstantExpression *)0x0) {
    (*((BaseExpression *)&((BaseExpression *)local_b0.type_._0_8_)->_vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
  local_b0.type_._0_8_ = (ParsedExpression *)0x0;
  if ((CastExpression *)local_70.type_._0_8_ != (CastExpression *)0x0) {
    (*((BaseExpression *)&((BaseExpression *)local_70.type_._0_8_)->_vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
  expr_00 = unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
            ::operator*((unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
                         *)&local_c0);
  Transformer::SetQueryLocation(&expr_00->super_ParsedExpression,query_location);
  _Var1._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (ComparisonExpression *)0x0;
  *(ComparisonExpression **)this = _Var1._M_head_impl;
  if (local_b8._M_head_impl != (ConstantExpression *)0x0) {
    (*((local_b8._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

static unique_ptr<ParsedExpression> TransformBooleanTestInternal(unique_ptr<ParsedExpression> argument,
                                                                 ExpressionType comparison_type, bool comparison_value,
                                                                 int query_location) {
	auto bool_value = make_uniq<ConstantExpression>(Value::BOOLEAN(comparison_value));
	Transformer::SetQueryLocation(*bool_value, query_location);
	// we cast the argument to bool to remove ambiguity wrt function binding on the comparison
	auto cast_argument = make_uniq<CastExpression>(LogicalType::BOOLEAN, std::move(argument));

	auto result = make_uniq<ComparisonExpression>(comparison_type, std::move(cast_argument), std::move(bool_value));
	Transformer::SetQueryLocation(*result, query_location);
	return std::move(result);
}